

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

int __thiscall
pbrt::PtexTextureBase::SampleTexture(PtexTextureBase *this,TextureEvalContext ctx,float *result)

{
  undefined1 auVar1 [16];
  span<float> vout;
  span<const_unsigned_char> vin;
  bool bVar2;
  uint uVar3;
  undefined8 uVar4;
  PtexTexture *tex;
  float *pfVar5;
  float *ptr;
  undefined4 *in_RSI;
  byte *in_RDI;
  long in_FS_OFFSET;
  float fVar6;
  uint in_stack_00000034;
  uint in_stack_00000038;
  uint in_stack_0000003c;
  uint in_stack_00000040;
  uint in_stack_00000044;
  int c;
  Float fResult [3];
  int i;
  uint8_t result8 [3];
  int firstChan;
  int nc;
  PtexFilter *filter;
  Options opts;
  PtexTexture *texture;
  String error;
  size_t in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 uVar7;
  float fVar8;
  PtexFilter *pPVar9;
  undefined4 *puVar10;
  undefined4 in_stack_ffffffffffffff00;
  uint uVar11;
  char (*in_stack_ffffffffffffff10) [19];
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined8 in_stack_ffffffffffffff20;
  int line;
  long *file;
  Options *opts_00;
  int local_ac;
  int local_84 [4];
  undefined1 local_73 [3];
  undefined4 local_70;
  uint local_6c;
  PtexFilter *local_68;
  Options local_60;
  PtexTexture *local_40;
  Options local_38;
  undefined4 *local_18;
  uint local_4;
  
  line = (int)((ulong)in_stack_ffffffffffffff20 >> 0x20);
  if ((*in_RDI & 1) == 0) {
    *in_RSI = 0;
    local_4 = 1;
  }
  else {
    *(long *)(in_FS_OFFSET + -0x5b0) = *(long *)(in_FS_OFFSET + -0x5b0) + 1;
    opts_00 = &local_38;
    local_18 = in_RSI;
    std::__cxx11::string::string((string *)opts_00);
    file = cache;
    uVar4 = std::__cxx11::string::c_str();
    tex = (PtexTexture *)(**(code **)(*file + 0x28))(file,uVar4,opts_00);
    local_40 = tex;
    if (tex == (PtexTexture *)0x0) {
      LogFatal<char_const(&)[19]>
                ((LogLevel)((ulong)opts_00 >> 0x20),(char *)file,line,
                 (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                 in_stack_ffffffffffffff10);
    }
    Ptex::v2_2::PtexFilter::Options::Options(&local_60,f_bspline,false,0.0,false);
    local_68 = Ptex::v2_2::PtexFilter::getFilter(tex,opts_00);
    uVar3 = (*local_40->_vptr_PtexTexture[0xb])();
    local_70 = 0;
    uVar11 = 0;
    pPVar9 = local_68;
    puVar10 = local_18;
    local_6c = uVar3;
    pfVar5 = Tuple2<pbrt::Point2,_float>::operator[]
                       ((Tuple2<pbrt::Point2,_float> *)&stack0x0000002c,0);
    fVar8 = *pfVar5;
    pfVar5 = Tuple2<pbrt::Point2,_float>::operator[]
                       ((Tuple2<pbrt::Point2,_float> *)&stack0x0000002c,1);
    (*pPVar9->_vptr_PtexFilter[3])
              ((ulong)(uint)fVar8,(ulong)(uint)*pfVar5,(ulong)in_stack_00000034,
               (ulong)in_stack_0000003c,(ulong)in_stack_00000038,(ulong)in_stack_00000040,
               SUB648(ZEXT464(0x3f800000),0),0,pPVar9,puVar10,(ulong)uVar11,(ulong)uVar3,
               (ulong)in_stack_00000044);
    (*local_68->_vptr_PtexFilter[2])();
    (*local_40->_vptr_PtexTexture[2])();
    bVar2 = TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
            ::operator!=((TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                          *)(in_RDI + 0x28),
                         (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                          *)&ColorEncodingHandle::Linear);
    uVar7 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffee0);
    if (bVar2) {
      for (local_84[3] = 0; local_84[3] < (int)local_6c; local_84[3] = local_84[3] + 1) {
        auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x437f0000),0),ZEXT416((uint)local_18[local_84[3]])
                                 ,SUB6416(ZEXT464(0x3f000000),0));
        fVar6 = Clamp<float,int,int>(auVar1._0_4_,0,0xff);
        local_73[local_84[3]] = (char)(int)fVar6;
      }
      ptr = (float *)(in_RDI + 0x28);
      pstd::MakeConstSpan<unsigned_char>((uchar *)ptr,in_stack_fffffffffffffec8);
      pstd::MakeSpan<float>(ptr,in_stack_fffffffffffffec8);
      vin.n._0_4_ = in_stack_ffffffffffffff00;
      vin.ptr = (uchar *)puVar10;
      vin.n._4_4_ = uVar11;
      vout.n = (size_t)pPVar9;
      vout.ptr = pfVar5;
      ColorEncodingHandle::ToLinear((ColorEncodingHandle *)CONCAT44(fVar8,uVar7),vin,vout);
      for (local_ac = 0; local_ac < (int)local_6c; local_ac = local_ac + 1) {
        local_18[local_ac] = local_84[local_ac];
      }
    }
    local_4 = local_6c;
    std::__cxx11::string::~string((string *)&local_38);
  }
  return local_4;
}

Assistant:

int PtexTextureBase::SampleTexture(TextureEvalContext ctx, float result[3]) const {
    if (!valid) {
        result[0] = 0.;
        return 1;
    }

    ++nLookups;
    Ptex::String error;
    Ptex::PtexTexture *texture = cache->get(filename.c_str(), error);
    CHECK(texture != nullptr);
    // TODO: make the filter an option?
    Ptex::PtexFilter::Options opts(Ptex::PtexFilter::FilterType::f_bspline);
    Ptex::PtexFilter *filter = Ptex::PtexFilter::getFilter(texture, opts);
    int nc = texture->numChannels();

    int firstChan = 0;
    filter->eval(result, firstChan, nc, ctx.faceIndex, ctx.uv[0], ctx.uv[1], ctx.dudx,
                 ctx.dvdx, ctx.dudy, ctx.dvdy);
    filter->release();
    texture->release();

    if (encoding != ColorEncodingHandle::Linear) {
        // It feels a little dirty to convert to 8-bits to run through the
        // encoding, but it's probably fine.
        uint8_t result8[3];
        for (int i = 0; i < nc; ++i)
            result8[i] = uint8_t(Clamp(result[i] * 255.f + 0.5f, 0, 255));

        // Handle Float == double.
        Float fResult[3];
        encoding.ToLinear(pstd::MakeConstSpan(result8, nc), pstd::MakeSpan(fResult, nc));
        for (int c = 0; c < nc; ++c)
            result[c] = fResult[c];
    }

    return nc;
}